

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c++
# Opt level: O2

void kj::_::throwRemovedWrongList(void)

{
  char (*in_RCX) [77];
  String SStack_1b8;
  Exception local_1a0;
  
  Debug::makeDescription<char_const(&)[77]>
            (&SStack_1b8,
             (Debug *)
             "\"tried to remove element from kj::List but the element is in a different list\"",
             "tried to remove element from kj::List but the element is in a different list",in_RCX);
  Exception::Exception
            (&local_1a0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list.c++"
             ,0x26,&SStack_1b8);
  throwFatalException(&local_1a0,0);
}

Assistant:

void throwRemovedWrongList() {
  kj::throwFatalException(KJ_EXCEPTION(FAILED,
      "tried to remove element from kj::List but the element is in a different list"));
}